

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

bool __thiscall Glucose::DoubleOption::parse(DoubleOption *this,char *str)

{
  char *pcVar1;
  double dVar2;
  char cVar3;
  char *pcVar4;
  void *__ptr;
  undefined1 uVar5;
  undefined1 extraout_AL;
  long lVar6;
  char *pcVar7;
  char **ppcVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  char *end;
  char *local_20;
  long extraout_RAX;
  
  if (*str != '-') {
    return false;
  }
  pcVar7 = str + (*str == '-');
  pcVar4 = (this->super_Option).name;
  cVar3 = *pcVar4;
  bVar11 = cVar3 == '\0';
  if (bVar11) {
    lVar6 = 0;
LAB_001166a3:
    pcVar7 = pcVar7 + lVar6;
  }
  else if (*pcVar7 == cVar3) {
    lVar6 = 1;
    do {
      cVar3 = pcVar4[lVar6];
      bVar11 = cVar3 == '\0';
      if (bVar11) goto LAB_001166a3;
      pcVar1 = pcVar7 + lVar6;
      lVar6 = lVar6 + 1;
    } while (*pcVar1 == cVar3);
  }
  else {
    bVar11 = false;
  }
  if (!bVar11) {
    return false;
  }
  if (*pcVar7 != '=') {
    return false;
  }
  pcVar7 = pcVar7 + (*pcVar7 == '=');
  dVar12 = strtod(pcVar7,&local_20);
  bVar11 = local_20 != (char *)0x0;
  if (!bVar11) {
    return bVar11;
  }
  ppcVar8 = &(this->super_Option).name;
  dVar2 = (this->range).end;
  if (dVar2 <= dVar12) {
    if ((this->range).end_inclusive == true) {
      if ((dVar12 == dVar2) && (!NAN(dVar12) && !NAN(dVar2))) goto LAB_001166f7;
    }
    parse();
  }
  else {
LAB_001166f7:
    dVar2 = (this->range).begin;
    if (dVar2 < dVar12) {
LAB_00116712:
      this->value = dVar12;
      return bVar11;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar12 == dVar2) && (!NAN(dVar12) && !NAN(dVar2))) goto LAB_00116712;
    }
  }
  parse();
  uVar5 = (undefined1)extraout_RAX;
  if (*ppcVar8 != (char *)0x0) {
    lVar6 = extraout_RAX;
    if (0 < *(int *)(ppcVar8 + 1)) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        pcVar4 = *ppcVar8;
        __ptr = *(void **)(pcVar4 + lVar10);
        if (__ptr != (void *)0x0) {
          pcVar1 = pcVar4 + lVar10 + 8;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          free(__ptr);
          pcVar1 = pcVar4 + lVar10;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          pcVar4 = pcVar4 + lVar10 + 0xc;
          pcVar4[0] = '\0';
          pcVar4[1] = '\0';
          pcVar4[2] = '\0';
          pcVar4[3] = '\0';
        }
        lVar9 = lVar9 + 1;
        lVar6 = (long)*(int *)(ppcVar8 + 1);
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < lVar6);
    }
    uVar5 = (undefined1)lVar6;
    *(undefined4 *)(ppcVar8 + 1) = 0;
    if ((char)pcVar7 != '\0') {
      free(*ppcVar8);
      *ppcVar8 = (char *)0x0;
      *(undefined4 *)((long)ppcVar8 + 0xc) = 0;
      uVar5 = extraout_AL;
    }
  }
  return (bool)uVar5;
}

Assistant:

DoubleOption(const char* c, const char* n, const char* d, double def = double(), DoubleRange r = DoubleRange(-HUGE_VAL, false, HUGE_VAL, false))
        : Option(n, d, c, "<double>"), range(r), value(def) {
        // FIXME: set LC_NUMERIC to "C" to make sure that strtof/strtod parses decimal point correctly.
    }